

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O3

void wabt::anon_unknown_16::NameGenerator::GenerateName
               (char *prefix,Index index,uint disambiguator,string *str)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  long *plVar6;
  size_type *psVar7;
  Index IVar8;
  uint uVar9;
  size_type *local_70;
  string __str_1;
  string __str;
  
  uVar1 = str->_M_string_length;
  sVar5 = strlen(prefix);
  std::__cxx11::string::_M_replace((string *)str,0,uVar1,prefix,sVar5);
  if (index != 0xffffffff) {
    uVar4 = 1;
    if (9 < index) {
      uVar3 = 4;
      IVar8 = index;
      do {
        uVar4 = uVar3;
        if (IVar8 < 100) {
          uVar4 = uVar4 - 2;
          goto LAB_00f46813;
        }
        if (IVar8 < 1000) {
          uVar4 = uVar4 - 1;
          goto LAB_00f46813;
        }
        if (IVar8 < 10000) goto LAB_00f46813;
        bVar2 = 99999 < IVar8;
        uVar3 = uVar4 + 4;
        IVar8 = IVar8 / 10000;
      } while (bVar2);
      uVar4 = uVar4 + 1;
    }
LAB_00f46813:
    __str_1.field_2._8_8_ = &__str._M_string_length;
    std::__cxx11::string::_M_construct
              ((string *)(__str_1.field_2._M_local_buf + 8),(ulong)uVar4,'\0');
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)__str_1.field_2._8_8_,(uint)__str._M_dataplus._M_p,index);
    std::__cxx11::string::_M_append
              ((string *)str,(char *)__str_1.field_2._8_8_,(ulong)__str._M_dataplus._M_p);
    if ((size_type *)__str_1.field_2._8_8_ != &__str._M_string_length) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
  }
  if (disambiguator != 0) {
    uVar4 = 1;
    if (9 < disambiguator) {
      uVar3 = 4;
      uVar9 = disambiguator;
      do {
        uVar4 = uVar3;
        if (uVar9 < 100) {
          uVar4 = uVar4 - 2;
          goto LAB_00f468b4;
        }
        if (uVar9 < 1000) {
          uVar4 = uVar4 - 1;
          goto LAB_00f468b4;
        }
        if (uVar9 < 10000) goto LAB_00f468b4;
        bVar2 = 99999 < uVar9;
        uVar3 = uVar4 + 4;
        uVar9 = uVar9 / 10000;
      } while (bVar2);
      uVar4 = uVar4 + 1;
    }
LAB_00f468b4:
    local_70 = &__str_1._M_string_length;
    std::__cxx11::string::_M_construct((string *)&local_70,(ulong)uVar4,'\0');
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_70,(uint)__str_1._M_dataplus._M_p,disambiguator);
    plVar6 = (long *)std::__cxx11::string::insert((string *)&local_70,0,1,'_');
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      __str._M_string_length = *psVar7;
      __str.field_2._M_allocated_capacity = plVar6[3];
      __str_1.field_2._8_8_ = &__str._M_string_length;
    }
    else {
      __str._M_string_length = *psVar7;
      __str_1.field_2._8_8_ = (size_type *)*plVar6;
    }
    __str._M_dataplus._M_p = (pointer)plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append
              ((string *)str,(char *)__str_1.field_2._8_8_,(ulong)__str._M_dataplus._M_p);
    if ((size_type *)__str_1.field_2._8_8_ != &__str._M_string_length) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    if (local_70 != &__str_1._M_string_length) {
      operator_delete(local_70);
    }
  }
  return;
}

Assistant:

void NameGenerator::GenerateName(const char* prefix,
                                 Index index,
                                 unsigned disambiguator,
                                 std::string* str) {
  *str = prefix;
  if (index != kInvalidIndex) {
    *str += std::to_string(index);
  }
  if (disambiguator != 0) {
    *str += '_' + std::to_string(disambiguator);
  }
}